

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2psf1.cpp
# Opt level: O0

bool bin2psf1(char *bin_path,char *psf_path,uint32_t load_address,uint32_t initial_pc,
             uint32_t initial_sp,char *region_name,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *tags)

{
  bool bVar1;
  uint value;
  size_t sVar2;
  undefined8 *__s;
  FILE *__stream;
  size_t sVar3;
  ssize_t sVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  allocator local_231;
  string local_230 [32];
  undefined4 local_210;
  undefined1 local_200 [8];
  ZlibWriter exe_z;
  char region_marker [256];
  FILE *bin_file;
  uint8_t *exe;
  uint32_t load_size;
  off_t bin_size;
  char *pcStack_38;
  uint32_t load_offset;
  char *region_name_local;
  uint32_t initial_sp_local;
  uint32_t initial_pc_local;
  uint32_t load_address_local;
  char *psf_path_local;
  char *bin_path_local;
  
  initial_sp_local = load_address;
  if (load_address >> 0x18 == 0) {
    initial_sp_local = load_address | 0x80000000;
  }
  if ((initial_sp_local >> 0x18 == 0x80) && ((load_address & 0xffffff) < 0x200000)) {
    sVar2 = path_getfilesize(bin_path);
    if (sVar2 == 0xffffffffffffffff) {
      fprintf(_stderr,"Error: File size error \"%s\"\n",bin_path);
      bin_path_local._7_1_ = false;
    }
    else if ((long)sVar2 < 0x200001) {
      value = (int)sVar2 + 0x7ffU & 0xfffff800;
      if ((load_address & 0xffffff) + value < 0x200001) {
        __s = (undefined8 *)operator_new__((ulong)(value + 0x800));
        if (__s == (undefined8 *)0x0) {
          fprintf(_stderr,"Error: Unable to allocate memory\n");
          bin_path_local._7_1_ = false;
        }
        else {
          memset(__s,0,(ulong)(value + 0x800));
          __stream = fopen(bin_path,"rb");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,"Error: Unable to open file \"%s\"\n",bin_path);
            if (__s != (undefined8 *)0x0) {
              operator_delete__(__s);
            }
            bin_path_local._7_1_ = false;
          }
          else {
            sVar3 = fread(__s + 0x100,1,sVar2,__stream);
            if (sVar3 == sVar2) {
              fclose(__stream);
              if ((region_name == (char *)0x0) || (pcStack_38 = region_name, *region_name == '\0'))
              {
                pcStack_38 = "North America";
              }
              sprintf(&exe_z.zbuf_changed,"Sony Computer Entertainment Inc. for %s area",pcStack_38)
              ;
              sVar2 = 0x45584520582d5350;
              *__s = 0x45584520582d5350;
              mput4l(initial_pc,(uint8_t *)(__s + 2));
              mput4l(initial_sp_local,(uint8_t *)(__s + 3));
              mput4l(value,(uint8_t *)((long)__s + 0x1c));
              mput4l(initial_sp,(uint8_t *)(__s + 6));
              strcpy((char *)((long)__s + 0x4c),&exe_z.zbuf_changed);
              ZlibWriter::ZlibWriter((ZlibWriter *)local_200,9);
              sVar4 = ZlibWriter::write((ZlibWriter *)local_200,(int)__s,
                                        (void *)(ulong)(value + 0x800),sVar2);
              if ((int)sVar4 == value + 0x800) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_230,psf_path,&local_231);
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::map(&local_268,tags);
                bVar1 = PSFFile::save((string *)local_230,'\x01',(uint8_t *)0x0,0,
                                      (ZlibWriter *)local_200,&local_268);
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~map(&local_268);
                std::__cxx11::string::~string(local_230);
                std::allocator<char>::~allocator((allocator<char> *)&local_231);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  if (__s != (undefined8 *)0x0) {
                    operator_delete__(__s);
                  }
                  bin_path_local._7_1_ = true;
                }
                else {
                  fprintf(_stderr,"Error: File write error \"%s\"\n",psf_path);
                  if (__s != (undefined8 *)0x0) {
                    operator_delete__(__s);
                  }
                  bin_path_local._7_1_ = false;
                }
              }
              else {
                fprintf(_stderr,"Error: Zlib compress error \"%s\"\n",psf_path);
                if (__s != (undefined8 *)0x0) {
                  operator_delete__(__s);
                }
                bin_path_local._7_1_ = false;
              }
              local_210 = 1;
              ZlibWriter::~ZlibWriter((ZlibWriter *)local_200);
            }
            else {
              fprintf(_stderr,"Error: File read error \"%s\"\n",bin_path);
              fclose(__stream);
              if (__s != (undefined8 *)0x0) {
                operator_delete__(__s);
              }
              bin_path_local._7_1_ = false;
            }
          }
        }
      }
      else {
        fprintf(_stderr,"Error: Address out of range (0x%08X + 0x%X) \"%s\"\n",
                (ulong)initial_sp_local,(ulong)value,bin_path);
        bin_path_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Error: File too large \"%s\"\n",bin_path);
      bin_path_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"Error: Invalid load address 0x%08X\n",(ulong)initial_sp_local);
    bin_path_local._7_1_ = false;
  }
  return bin_path_local._7_1_;
}

Assistant:

bool bin2psf1(const char * bin_path, const char * psf_path, uint32_t load_address, uint32_t initial_pc, uint32_t initial_sp, const char * region_name, std::map<std::string, std::string> tags)
{
	uint32_t load_offset = load_address & 0xffffff;

	if ((load_address >> 24) == 0) {
		load_address |= 0x80000000;
	}

	if ((load_address >> 24) != 0x80 || load_offset >= MAX_PSX_ROM_SIZE) {
		fprintf(stderr, "Error: Invalid load address 0x%08X\n", load_address);
		return false;
	}

	off_t bin_size = path_getfilesize(bin_path);
	if (bin_size == -1) {
		fprintf(stderr, "Error: File size error \"%s\"\n", bin_path);
		return false;
	}

	if (bin_size > MAX_PSX_ROM_SIZE) {
		fprintf(stderr, "Error: File too large \"%s\"\n", bin_path);
		return false;
	}

	uint32_t load_size = (uint32_t)bin_size;
	load_size = (load_size + PSX_ROM_ALIGN_SIZE - 1) / PSX_ROM_ALIGN_SIZE * PSX_ROM_ALIGN_SIZE;

	if (load_offset + load_size > MAX_PSX_ROM_SIZE) {
		fprintf(stderr, "Error: Address out of range (0x%08X + 0x%X) \"%s\"\n", load_address, load_size, bin_path);
		return false;
	}

	uint8_t * exe = new uint8_t[PSF_EXE_HEADER_SIZE + load_size];
	if (exe == NULL) {
		fprintf(stderr, "Error: Unable to allocate memory\n");
		return false;
	}
	memset(exe, 0, PSF_EXE_HEADER_SIZE + load_size);

	// Read input file
	FILE * bin_file = fopen(bin_path, "rb");
	if (bin_file == NULL) {
		fprintf(stderr, "Error: Unable to open file \"%s\"\n", bin_path);
		delete[] exe;
		return false;
	}

	if (fread(&exe[PSF_EXE_HEADER_SIZE], 1, bin_size, bin_file) != bin_size) {
		fprintf(stderr, "Error: File read error \"%s\"\n", bin_path);
		fclose(bin_file);
		delete[] exe;
		return false;
	}

	fclose(bin_file);

	// Construct PSX-EXE header
	char region_marker[256];
	if (region_name == NULL || region_name[0] == '\0') {
		region_name = "North America";
	}
	sprintf(region_marker, "Sony Computer Entertainment Inc. for %s area", region_name);

	memcpy(exe, "PS-X EXE", 8);
	mput4l(initial_pc, &exe[0x10]);
	mput4l(load_address, &exe[0x18]);
	mput4l(load_size, &exe[0x1c]);
	mput4l(initial_sp, &exe[0x30]);
	strcpy((char *)(&exe[0x4c]), region_marker);

	// Write to PSF1 file
	ZlibWriter exe_z(Z_BEST_COMPRESSION);
	if (exe_z.write(exe, PSF_EXE_HEADER_SIZE + load_size) != PSF_EXE_HEADER_SIZE + load_size) {
		fprintf(stderr, "Error: Zlib compress error \"%s\"\n", psf_path);
		delete[] exe;
		return false;
	}
	if (!PSFFile::save(psf_path, PSF1_PSF_VERSION, NULL, 0, exe_z, tags)) {
		fprintf(stderr, "Error: File write error \"%s\"\n", psf_path);
		delete[] exe;
		return false;
	}

	delete[] exe;
	return true;
}